

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O0

int Gia_ManGlaRefine(Gia_Man_t *p,Abc_Cex_t *pCex,int fMinCut,int fVerbose)

{
  long lVar1;
  Vec_Int_t *p_00;
  Abc_Cex_t *pCex_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Gia_Obj_t *pObj_00;
  abctime aVar7;
  Aig_Man_t *pAVar8;
  bool bVar9;
  Gia_Obj_t *local_88;
  Gia_Obj_t *pObj;
  int Counter;
  int nOnes;
  abctime clk;
  int local_68;
  int iObjId;
  int i;
  int f;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  Abc_Cex_t *pCare;
  Aig_Man_t *pAig;
  Gia_Man_t *pAbs;
  Abc_Cex_t *pCexNew;
  int local_28;
  int fAddOneLayer;
  int fVerbose_local;
  int fMinCut_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  pCexNew._4_4_ = 1;
  pAbs = (Gia_Man_t *)0x0;
  local_28 = fVerbose;
  fAddOneLayer = fMinCut;
  _fVerbose_local = pCex;
  pCex_local = (Abc_Cex_t *)p;
  aVar6 = Abc_Clock();
  pObj._4_4_ = 0;
  pObj._0_4_ = 0;
  lVar1._0_4_ = pCex_local[0x13].iFrame;
  lVar1._4_4_ = pCex_local[0x13].nRegs;
  if (lVar1 == 0) {
    Abc_Print(1,"Gia_ManGlaRefine(): Abstraction gate map is missing.\n");
    p_local._4_4_ = -1;
  }
  else {
    pAig = (Aig_Man_t *)
           Gia_ManDupAbsGates((Gia_Man_t *)pCex_local,*(Vec_Int_t **)&pCex_local[0x13].iFrame);
    Gia_ManStop((Gia_Man_t *)pAig);
    pAig = (Aig_Man_t *)
           Gia_ManDupAbsGates((Gia_Man_t *)pCex_local,*(Vec_Int_t **)&pCex_local[0x13].iFrame);
    iVar2 = Gia_ManPiNum((Gia_Man_t *)pAig);
    if (iVar2 == _fVerbose_local->nPis) {
      iVar2 = Gia_ManVerifyCex((Gia_Man_t *)pAig,_fVerbose_local,0);
      if (iVar2 == 0) {
        Abc_Print(1,"Gia_ManGlaRefine(): The initial counter-example is invalid.\n");
      }
      Gia_ManGlaCollect((Gia_Man_t *)pCex_local,*(Vec_Int_t **)&pCex_local[0x13].iFrame,&vPPis,
                        (Vec_Int_t **)&i,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
      iVar2 = Vec_IntSize(vPPis);
      iVar3 = Vec_IntSize(_i);
      iVar4 = Gia_ManPiNum((Gia_Man_t *)pAig);
      if (iVar2 + iVar3 != iVar4) {
        __assert_fail("Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                      ,0x7f,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
      }
      if (pCexNew._4_4_ == 0) {
        pAVar8 = Gia_ManToAigSimple((Gia_Man_t *)pAig);
        pCex_00 = _fVerbose_local;
        pCare = (Abc_Cex_t *)pAVar8;
        iVar2 = Vec_IntSize(vPPis);
        vPis = (Vec_Int_t *)Saig_ManCbaFindCexCareBits(pAVar8,pCex_00,iVar2,local_28);
        Aig_ManStop((Aig_Man_t *)pCare);
        if (vPis == (Vec_Int_t *)0x0) {
          Abc_Print(1,"Counter-example minimization has failed.\n");
        }
        clk._4_4_ = -1;
        for (iObjId = 0; iObjId <= vPis->nSize; iObjId = iObjId + 1) {
          for (local_68 = 0; local_68 < *(int *)((long)&vPis->pArray + 4); local_68 = local_68 + 1)
          {
            iVar2 = Abc_InfoHasBit((uint *)&vPis[1].nSize,
                                   *(int *)&vPis->pArray +
                                   iObjId * *(int *)((long)&vPis->pArray + 4) + local_68);
            if (iVar2 != 0) {
              pObj._4_4_ = pObj._4_4_ + 1;
              iVar2 = Vec_IntSize(vPPis);
              p_00 = _i;
              if (local_68 < iVar2) {
                __assert_fail("i >= Vec_IntSize(vPis)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                              ,0xc5,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
              }
              iVar2 = Vec_IntSize(vPPis);
              clk._4_4_ = Vec_IntEntry(p_00,local_68 - iVar2);
              if ((clk._4_4_ < 1) ||
                 (iVar2 = Gia_ManObjNum((Gia_Man_t *)pCex_local), iVar2 <= clk._4_4_)) {
                __assert_fail("iObjId > 0 && iObjId < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                              ,199,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
              }
              iVar2 = Vec_IntEntry(*(Vec_Int_t **)&pCex_local[0x13].iFrame,clk._4_4_);
              if (iVar2 < 1) {
                iVar2 = Vec_IntEntry(*(Vec_Int_t **)&pCex_local[0x13].iFrame,clk._4_4_);
                if (iVar2 != 0) {
                  __assert_fail("Vec_IntEntry( p->vGateClasses, iObjId ) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                                ,0xca,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
                }
                Vec_IntWriteEntry(*(Vec_Int_t **)&pCex_local[0x13].iFrame,clk._4_4_,1);
                pObj._0_4_ = (uint)pObj + 1;
              }
            }
          }
        }
        Abc_CexFree((Abc_Cex_t *)vPis);
        if (local_28 != 0) {
          Abc_Print(1,"Essential bits = %d.  Additional objects = %d.  ",(ulong)pObj._4_4_,
                    (ulong)(uint)pObj);
          aVar7 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar7 - aVar6);
        }
        if (clk._4_4_ == -1) {
          pAbs = (Gia_Man_t *)Gia_ManCexRemap((Gia_Man_t *)pCex_local,_fVerbose_local,vPPis);
          Abc_Print(1,"Procedure &gla_refine found a real counter-example in frame %d.\n",
                    (ulong)(uint)*(int *)((long)&pAbs->pName + 4));
        }
      }
      else {
        pObj_00 = Gia_ManConst0((Gia_Man_t *)pAig);
        Gia_ObjTerSimSet0(pObj_00);
        for (iObjId = 0; iObjId <= _fVerbose_local->iFrame; iObjId = iObjId + 1) {
          local_68 = 0;
          while( true ) {
            iVar2 = Gia_ManPiNum((Gia_Man_t *)pAig);
            bVar9 = false;
            if (local_68 < iVar2) {
              local_88 = Gia_ManCi((Gia_Man_t *)pAig,local_68);
              bVar9 = local_88 != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            iVar2 = Vec_IntSize(vPPis);
            if (local_68 < iVar2) {
              iVar2 = Abc_InfoHasBit((uint *)(_fVerbose_local + 1),
                                     _fVerbose_local->nRegs + _fVerbose_local->nPis * iObjId +
                                     local_68);
              if (iVar2 == 0) {
                Gia_ObjTerSimSet0(local_88);
              }
              else {
                Gia_ObjTerSimSet1(local_88);
              }
            }
            else {
              Gia_ObjTerSimSetX(local_88);
            }
            local_68 = local_68 + 1;
          }
          local_68 = 0;
          while( true ) {
            iVar2 = Gia_ManRegNum((Gia_Man_t *)pAig);
            pAVar8 = pAig;
            bVar9 = false;
            if (local_68 < iVar2) {
              iVar2 = Gia_ManPiNum((Gia_Man_t *)pAig);
              local_88 = Gia_ManCi((Gia_Man_t *)pAVar8,iVar2 + local_68);
              bVar9 = local_88 != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            if (iObjId == 0) {
              Gia_ObjTerSimSet0(local_88);
            }
            else {
              Gia_ObjTerSimRo((Gia_Man_t *)pAig,local_88);
            }
            local_68 = local_68 + 1;
          }
          local_68 = 0;
          while( true ) {
            bVar9 = false;
            if (local_68 < *(int *)&pAig->vCos) {
              local_88 = Gia_ManObj((Gia_Man_t *)pAig,local_68);
              bVar9 = local_88 != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            iVar2 = Gia_ObjIsAnd(local_88);
            if (iVar2 != 0) {
              Gia_ObjTerSimAnd(local_88);
            }
            local_68 = local_68 + 1;
          }
          local_68 = 0;
          while( true ) {
            iVar2 = Vec_IntSize((Vec_Int_t *)(pAig->Ghost).pFanin1);
            bVar9 = false;
            if (local_68 < iVar2) {
              local_88 = Gia_ManCo((Gia_Man_t *)pAig,local_68);
              bVar9 = local_88 != (Gia_Obj_t *)0x0;
            }
            if (!bVar9) break;
            Gia_ObjTerSimCo(local_88);
            local_68 = local_68 + 1;
          }
        }
        local_88 = Gia_ManPo((Gia_Man_t *)pAig,0);
        iVar2 = Gia_ObjTerSimGet1(local_88);
        if (iVar2 != 0) {
          pAbs = (Gia_Man_t *)Gia_ManCexRemap((Gia_Man_t *)pCex_local,_fVerbose_local,vPPis);
          Abc_Print(1,"Procedure &gla_refine found a real counter-example in frame %d.\n",
                    (ulong)(uint)*(int *)((long)&pAbs->pName + 4));
        }
        local_68 = 0;
        while( true ) {
          bVar9 = false;
          if (local_68 < *(int *)&pAig->vCos) {
            local_88 = Gia_ManObj((Gia_Man_t *)pAig,local_68);
            bVar9 = local_88 != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          Gia_ObjTerSimSetC(local_88);
          local_68 = local_68 + 1;
        }
        if (pAbs == (Gia_Man_t *)0x0) {
          for (local_68 = 0; iVar2 = Vec_IntSize(_i), local_68 < iVar2; local_68 = local_68 + 1) {
            iVar2 = Vec_IntEntry(_i,local_68);
            iVar3 = Vec_IntEntry(*(Vec_Int_t **)&pCex_local[0x13].iFrame,iVar2);
            if (iVar3 != 0) {
              __assert_fail("Vec_IntEntry( p->vGateClasses, iObjId ) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                            ,0xac,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
            }
            Vec_IntWriteEntry(*(Vec_Int_t **)&pCex_local[0x13].iFrame,iVar2,1);
          }
          if (local_28 != 0) {
            uVar5 = Vec_IntSize(_i);
            Abc_Print(1,"Additional objects = %d.  ",(ulong)uVar5);
            aVar7 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar7 - aVar6);
          }
        }
      }
      Vec_IntFree(vPPis);
      Vec_IntFree(_i);
      Gia_ManStop((Gia_Man_t *)pAig);
      if (pAbs == (Gia_Man_t *)0x0) {
        if (fAddOneLayer != 0) {
          Nwk_ManDeriveMinCut((Gia_Man_t *)pCex_local,local_28);
        }
        p_local._4_4_ = -1;
      }
      else {
        if (*(long *)&pCex_local[0x10].nBits != 0) {
          free(*(void **)&pCex_local[0x10].nBits);
          *(undefined8 *)&pCex_local[0x10].nBits = 0;
        }
        *(Gia_Man_t **)&pCex_local[0x10].nBits = pAbs;
        p_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(1,"Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n");
      Gia_ManStop((Gia_Man_t *)pAig);
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManGlaRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int fMinCut, int fVerbose )
{
    extern void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose );
    int fAddOneLayer = 1;
    Abc_Cex_t * pCexNew = NULL;
    Gia_Man_t * pAbs;
    Aig_Man_t * pAig;
    Abc_Cex_t * pCare;
    Vec_Int_t * vPis, * vPPis;
    int f, i, iObjId;
    abctime clk = Abc_Clock();
    int nOnes = 0, Counter = 0;
    if ( p->vGateClasses == NULL )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): Abstraction gate map is missing.\n" );
        return -1;
    }
    // derive abstraction
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    Gia_ManStop( pAbs );
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    if ( Gia_ManPiNum(pAbs) != pCex->nPis )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n" );
        Gia_ManStop( pAbs );
        return -1;
    }
    if ( !Gia_ManVerifyCex( pAbs, pCex, 0 ) )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is invalid.\n" );
//        Gia_ManStop( pAbs );
//        return -1;
    }
//    else
//        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is correct.\n" );
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, &vPis, &vPPis, NULL, NULL );
    assert( Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs) );
    // add missing logic
    if ( fAddOneLayer )
    {
        Gia_Obj_t * pObj;
        // check if this is a real counter-example
        Gia_ObjTerSimSet0( Gia_ManConst0(pAbs) );
        for ( f = 0; f <= pCex->iFrame; f++ )
        {
            Gia_ManForEachPi( pAbs, pObj, i )
            {
                if ( i >= Vec_IntSize(vPis) ) // PPIs
                    Gia_ObjTerSimSetX( pObj );
                else if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                    Gia_ObjTerSimSet1( pObj );
                else
                    Gia_ObjTerSimSet0( pObj );
            }
            Gia_ManForEachRo( pAbs, pObj, i )
            {
                if ( f == 0 )
                    Gia_ObjTerSimSet0( pObj );
                else
                    Gia_ObjTerSimRo( pAbs, pObj );
            }
            Gia_ManForEachAnd( pAbs, pObj, i )
                Gia_ObjTerSimAnd( pObj );
            Gia_ManForEachCo( pAbs, pObj, i )
                Gia_ObjTerSimCo( pObj );
        }
        pObj = Gia_ManPo( pAbs, 0 );
        if ( Gia_ObjTerSimGet1(pObj) )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
//        else
//            Abc_Print( 1, "CEX is not real.\n" );
        Gia_ManForEachObj( pAbs, pObj, i )
            Gia_ObjTerSimSetC( pObj );
        if ( pCexNew == NULL )
        {
            // grow one layer
            Vec_IntForEachEntry( vPPis, iObjId, i )
            {
                assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
            }
            if ( fVerbose )
            {
                Abc_Print( 1, "Additional objects = %d.  ", Vec_IntSize(vPPis) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
        }
    }
    else
    {
        // minimize the CEX
        pAig = Gia_ManToAigSimple( pAbs );
        pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, Vec_IntSize(vPis), fVerbose );
        Aig_ManStop( pAig );
        if ( pCare == NULL )
            Abc_Print( 1, "Counter-example minimization has failed.\n" );
        // add new objects to the map
        iObjId = -1;
        for ( f = 0; f <= pCare->iFrame; f++ )
            for ( i = 0; i < pCare->nPis; i++ )
                if ( Abc_InfoHasBit( pCare->pData, pCare->nRegs + f * pCare->nPis + i ) )
                {
                    nOnes++;
                    assert( i >= Vec_IntSize(vPis) );
                    iObjId = Vec_IntEntry( vPPis, i - Vec_IntSize(vPis) );
                    assert( iObjId > 0 && iObjId < Gia_ManObjNum(p) );
                    if ( Vec_IntEntry( p->vGateClasses, iObjId ) > 0 )
                        continue;
                    assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                    Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
    //                Abc_Print( 1, "Adding object %d.\n", iObjId );
    //                Gia_ObjPrint( p, Gia_ManObj(p, iObjId) );
                    Counter++;
                }
        Abc_CexFree( pCare );
        if ( fVerbose )
        {
            Abc_Print( 1, "Essential bits = %d.  Additional objects = %d.  ", nOnes, Counter );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        // consider the case of SAT
        if ( iObjId == -1 )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Gia_ManStop( pAbs );
    if ( pCexNew )
    {
        ABC_FREE( p->pCexSeq );
        p->pCexSeq = pCexNew;
        return 0;
    }
    // extract abstraction to include min-cut
    if ( fMinCut )
        Nwk_ManDeriveMinCut( p, fVerbose );
    return -1;
}